

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

void __thiscall google::protobuf::internal::MapFieldBase::~MapFieldBase(MapFieldBase *this)

{
  Nullable<const_char_*> failure_msg;
  ReflectionPayload *this_00;
  LogMessageFatal local_20;
  void *local_10;
  
  local_20.super_LogMessage._0_8_ = arena(this);
  local_10 = (void *)0x0;
  failure_msg = absl::lts_20250127::log_internal::
                Check_EQImpl<google::protobuf::Arena*,decltype(nullptr)>
                          ((Arena **)&local_20,&local_10,"arena() == nullptr");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    this_00 = maybe_payload(this);
    if (this_00 != (ReflectionPayload *)0x0) {
      ReflectionPayload::~ReflectionPayload(this_00);
    }
    operator_delete(this_00,0x28);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_field.cc"
             ,0x22,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

MapFieldBase::~MapFieldBase() {
  ABSL_DCHECK_EQ(arena(), nullptr);
  delete maybe_payload();
}